

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.cc
# Opt level: O3

Arg * __thiscall
fmt::internal::PrintfFormatter<wchar_t>::get_arg
          (Arg *__return_storage_ptr__,PrintfFormatter<wchar_t> *this,wchar_t *s,uint arg_index)

{
  FormatError *this_00;
  CStringRef message;
  char *error;
  char *local_18;
  
  local_18 = (char *)0x0;
  if (arg_index == 0xffffffff) {
    FormatterBase::next_arg(__return_storage_ptr__,(FormatterBase *)this,&local_18);
  }
  else {
    FormatterBase::get_arg(__return_storage_ptr__,(FormatterBase *)this,arg_index - 1,&local_18);
  }
  if (local_18 != (char *)0x0) {
    this_00 = (FormatError *)__cxa_allocate_exception(0x10);
    message.data_ = local_18;
    if (*s == L'\0') {
      message.data_ = "invalid format string";
    }
    FormatError::FormatError(this_00,message);
    __cxa_throw(this_00,&FormatError::typeinfo,FormatError::~FormatError);
  }
  return __return_storage_ptr__;
}

Assistant:

Arg fmt::internal::PrintfFormatter<Char>::get_arg(
    const Char *s, unsigned arg_index) {
  (void)s;
  const char *error = 0;
  Arg arg = arg_index == UINT_MAX ?
    next_arg(error) : FormatterBase::get_arg(arg_index - 1, error);
  if (error)
    FMT_THROW(FormatError(!*s ? "invalid format string" : error));
  return arg;
}